

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O3

void __thiscall TCPConnection::Tick(TCPConnection *this)

{
  osQueue *this_00;
  ProtocolTCP *pPVar1;
  int iVar2;
  uint64_t uVar3;
  DataBuffer *buffer;
  long lVar4;
  uint32_t uVar5;
  
  osMutex::Take(&this->HoldingQueueLock,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/tcp_stack/TCPConnection.cpp"
                ,0x165);
  this_00 = &this->HoldingQueue;
  iVar2 = osQueue::GetCount(this_00);
  uVar3 = osTime::GetTime();
  uVar5 = (uint32_t)uVar3;
  if (0 < iVar2) {
    do {
      buffer = (DataBuffer *)osQueue::Get(this_00);
      if ((int)(buffer->Time_us - (uVar5 - 100000)) < 1) {
        printf("TCP retransmit timeout %u, %u, delta %d\n",(ulong)buffer->Time_us,
               (ulong)(uVar5 - 100000));
        buffer->Time_us = uVar5;
        ProtocolIPv4::Retransmit(this->IP,buffer);
      }
      osQueue::Put(this_00,buffer);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  osMutex::Give(&this->HoldingQueueLock);
  pPVar1 = this->TCP;
  lVar4 = 0;
  do {
    if ((*(int *)(&pPVar1->field_0x0 + lVar4) == 10) &&
       (999999 < uVar5 - *(int *)(&pPVar1->field_0x24 + lVar4))) {
      *(undefined4 *)(&pPVar1->field_0x0 + lVar4) = 0;
    }
    lVar4 = lVar4 + 0x370;
  } while (lVar4 != 0x1130);
  if (this->LastAck == this->AcknowledgementNumber) {
    return;
  }
  SendFlags(this,'\x10');
  return;
}

Assistant:

void TCPConnection::Tick()
{
    int count;
    int i;
    DataBuffer* buffer;
    uint32_t currentTime_us;
    uint32_t timeoutTime_us;

    HoldingQueueLock.Take(__FILE__, __LINE__);
    count = HoldingQueue.GetCount();
    currentTime_us = (int32_t)osTime::GetTime();

    // Check for retransmit timeout
    timeoutTime_us = currentTime_us - TCP_RETRANSMIT_TIMEOUT_US;
    for (i = 0; i < count; i++)
    {
        buffer = (DataBuffer*)HoldingQueue.Get();
        if ((int32_t)(buffer->Time_us - timeoutTime_us) <= 0)
        {
            printf("TCP retransmit timeout %u, %u, delta %d\n",
                   buffer->Time_us,
                   timeoutTime_us,
                   (int32_t)(buffer->Time_us - timeoutTime_us));
            buffer->Time_us = currentTime_us;
            IP->Retransmit(buffer);
        }

        HoldingQueue.Put(buffer);
    }
    HoldingQueueLock.Give();

    // Check for TIMED_WAIT timeouts
    for (i = 0; i < TCP_MAX_CONNECTIONS; i++)
    {
        if (TCP->ConnectionList[i].State == TIMED_WAIT)
        {
            if (currentTime_us - TCP->ConnectionList[i].Time_us >= TCP_TIMED_WAIT_TIMEOUT_US)
            {
                TCP->ConnectionList[i].State = CLOSED;
            }
        }
    }

    // Check for delayed ACK
    if (LastAck != AcknowledgementNumber)
    {
        SendFlags(FLAG_ACK);
    }
}